

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_panel_dfs.h
# Opt level: O2

void __thiscall
Eigen::internal::SparseLUImpl<double,int>::
dfs_kernel<Eigen::internal::panel_dfs_traits<Eigen::Matrix<int,_1,1,0,_1,1>>>
          (SparseLUImpl<double,int> *this,int jj,IndexVector *perm_r,int *nseg,
          IndexVector *panel_lsub,IndexVector *segrep,
          Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *repfnz_col,
          IndexVector *xprune,
          Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *marker,
          IndexVector *parent,IndexVector *xplore,GlobalLU_t *glu,int *nextl_col,int krow,
          panel_dfs_traits<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *traits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  int *piVar6;
  long lVar7;
  long index;
  ulong index_00;
  int iVar8;
  ulong index_01;
  Scalar SVar9;
  long index_02;
  
  lVar7 = (long)krow;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>::
  operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
              *)marker,lVar7);
  pSVar4 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)marker,lVar7);
  *pSVar4 = jj;
  pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)perm_r,lVar7);
  iVar1 = *pSVar5;
  if ((long)iVar1 == -1) {
    iVar1 = *nextl_col;
    *nextl_col = iVar1 + 1;
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)panel_lsub,
                        (long)iVar1);
    *pSVar5 = krow;
  }
  else {
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,
                        (long)iVar1);
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,
                        (long)*pSVar5 + 1);
    index_01 = (long)*pSVar5 - 1;
    pSVar4 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)repfnz_col,index_01);
    if (*pSVar4 == -1) {
      pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)parent,index_01
                         );
      *pSVar5 = -1;
      pSVar4 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)repfnz_col,index_01);
      *pSVar4 = iVar1;
      pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                          index_01);
      SVar9 = *pSVar5;
      piVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)xprune,index_01
                         );
LAB_00174aed:
      do {
        iVar1 = *piVar6;
        lVar7 = (long)SVar9;
        while( true ) {
          iVar8 = (int)index_01;
          index_02 = (long)iVar8;
          if (iVar1 <= (int)lVar7) break;
          pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->lsub,
                              lVar7);
          iVar2 = *pSVar5;
          index = (long)iVar2;
          pSVar4 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                                 *)marker,index);
          if (*pSVar4 != jj) {
            pSVar4 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                                   *)marker,index);
            *pSVar4 = jj;
            pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)perm_r,
                                index);
            iVar3 = *pSVar5;
            if ((long)iVar3 == -1) {
              iVar8 = *nextl_col;
              *nextl_col = iVar8 + 1;
              pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                  panel_lsub,(long)iVar8);
              *pSVar5 = iVar2;
            }
            else {
              pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                  &glu->supno,(long)iVar3);
              pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,
                                  (long)*pSVar5 + 1);
              index_00 = (long)*pSVar5 - 1;
              pSVar4 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                       ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                                     *)repfnz_col,index_00);
              if (*pSVar4 == -1) {
                pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                    xplore,index_02);
                *pSVar5 = (int)lVar7 + 1;
                pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                    parent,index_00);
                *pSVar5 = iVar8;
                pSVar4 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                                       *)repfnz_col,index_00);
                *pSVar4 = iVar3;
                pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                    &glu->xlsub,index_00);
                SVar9 = *pSVar5;
                piVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                    xprune,index_00);
                index_01 = index_00 & 0xffffffff;
                goto LAB_00174aed;
              }
              if (iVar3 < *pSVar4) {
                pSVar4 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                                       *)repfnz_col,index_00);
                *pSVar4 = iVar3;
              }
            }
          }
          lVar7 = lVar7 + 1;
        }
        if (traits->m_marker[index_02] < traits->m_jcol) {
          traits->m_marker[index_02] = jj;
          pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)segrep,
                              (long)*nseg);
          *pSVar5 = iVar8;
          *nseg = *nseg + 1;
        }
        pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)parent,
                            index_02);
        index_01 = (ulong)*pSVar5;
        if (index_01 == 0xffffffffffffffff) {
          return;
        }
        pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)xplore,
                            index_01);
        SVar9 = *pSVar5;
        piVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)xprune,
                            index_01);
      } while( true );
    }
    if (iVar1 < *pSVar4) {
      pSVar4 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)repfnz_col,index_01);
      *pSVar4 = iVar1;
    }
  }
  return;
}

Assistant:

void SparseLUImpl<Scalar,Index>::dfs_kernel(const Index jj, IndexVector& perm_r,
                   Index& nseg, IndexVector& panel_lsub, IndexVector& segrep,
                   Ref<IndexVector> repfnz_col, IndexVector& xprune, Ref<IndexVector> marker, IndexVector& parent,
                   IndexVector& xplore, GlobalLU_t& glu,
                   Index& nextl_col, Index krow, Traits& traits
                  )
{
  
  Index kmark = marker(krow);
      
  // For each unmarked krow of jj
  marker(krow) = jj; 
  Index kperm = perm_r(krow); 
  if (kperm == emptyIdxLU ) {
    // krow is in L : place it in structure of L(*, jj)
    panel_lsub(nextl_col++) = krow;  // krow is indexed into A
    
    traits.mem_expand(panel_lsub, nextl_col, kmark);
  }
  else 
  {
    // krow is in U : if its supernode-representative krep
    // has been explored, update repfnz(*)
    // krep = supernode representative of the current row
    Index krep = glu.xsup(glu.supno(kperm)+1) - 1; 
    // First nonzero element in the current column:
    Index myfnz = repfnz_col(krep); 
    
    if (myfnz != emptyIdxLU )
    {
      // Representative visited before
      if (myfnz > kperm ) repfnz_col(krep) = kperm; 
      
    }
    else 
    {
      // Otherwise, perform dfs starting at krep
      Index oldrep = emptyIdxLU; 
      parent(krep) = oldrep; 
      repfnz_col(krep) = kperm; 
      Index xdfs =  glu.xlsub(krep); 
      Index maxdfs = xprune(krep); 
      
      Index kpar;
      do 
      {
        // For each unmarked kchild of krep
        while (xdfs < maxdfs) 
        {
          Index kchild = glu.lsub(xdfs); 
          xdfs++; 
          Index chmark = marker(kchild); 
          
          if (chmark != jj ) 
          {
            marker(kchild) = jj; 
            Index chperm = perm_r(kchild); 
            
            if (chperm == emptyIdxLU) 
            {
              // case kchild is in L: place it in L(*, j)
              panel_lsub(nextl_col++) = kchild;
              traits.mem_expand(panel_lsub, nextl_col, chmark);
            }
            else
            {
              // case kchild is in U :
              // chrep = its supernode-rep. If its rep has been explored, 
              // update its repfnz(*)
              Index chrep = glu.xsup(glu.supno(chperm)+1) - 1; 
              myfnz = repfnz_col(chrep); 
              
              if (myfnz != emptyIdxLU) 
              { // Visited before 
                if (myfnz > chperm) 
                  repfnz_col(chrep) = chperm; 
              }
              else 
              { // Cont. dfs at snode-rep of kchild
                xplore(krep) = xdfs; 
                oldrep = krep; 
                krep = chrep; // Go deeper down G(L)
                parent(krep) = oldrep; 
                repfnz_col(krep) = chperm; 
                xdfs = glu.xlsub(krep); 
                maxdfs = xprune(krep); 
                
              } // end if myfnz != -1
            } // end if chperm == -1 
                
          } // end if chmark !=jj
        } // end while xdfs < maxdfs
        
        // krow has no more unexplored nbrs :
        //    Place snode-rep krep in postorder DFS, if this 
        //    segment is seen for the first time. (Note that 
        //    "repfnz(krep)" may change later.)
        //    Baktrack dfs to its parent
        if(traits.update_segrep(krep,jj))
        //if (marker1(krep) < jcol )
        {
          segrep(nseg) = krep; 
          ++nseg; 
          //marker1(krep) = jj; 
        }
        
        kpar = parent(krep); // Pop recursion, mimic recursion 
        if (kpar == emptyIdxLU) 
          break; // dfs done 
        krep = kpar; 
        xdfs = xplore(krep); 
        maxdfs = xprune(krep); 

      } while (kpar != emptyIdxLU); // Do until empty stack 
      
    } // end if (myfnz = -1)

  } // end if (kperm == -1)   
}